

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O1

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  int iVar21;
  void *pvVar22;
  void *pvVar23;
  ulong uVar24;
  void *pvVar25;
  void *pvVar26;
  void *pvVar27;
  long lVar28;
  uint *puVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  void *pvVar33;
  long lVar34;
  undefined4 uVar35;
  ulong uVar36;
  void *pvVar37;
  long lVar38;
  void *pvVar39;
  void *pvVar40;
  int k;
  long lVar41;
  void *pvVar42;
  short tmp [6] [3];
  ulong local_118;
  void *local_108;
  void *local_100;
  void *local_f8;
  Mat local_a8;
  undefined8 local_60;
  short sStack_58;
  uint auStack_56 [9];
  
  uVar24 = (ulong)(uint)outch;
  local_a8.cstep = 0;
  local_a8.data = (void *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.elemsize = 0;
  local_a8.elempack = 0;
  local_a8.allocator = (Allocator *)0x0;
  local_a8.dims = 0;
  local_a8.w = 0;
  local_a8.h = 0;
  local_a8.d = 0;
  local_a8.c = 0;
  Mat::create(&local_a8,0x24,inch,outch,2,(Allocator *)0x0);
  if (0 < outch) {
    pvVar40 = kernel->data;
    local_108 = local_a8.data;
    local_118 = 0;
    do {
      if (0 < inch) {
        iVar18 = inch * 9 * (int)local_118;
        uVar20 = 0;
        pvVar25 = local_108;
        do {
          lVar41 = uVar20 * 9;
          cVar1 = *(char *)((long)pvVar40 + lVar41 + iVar18);
          cVar2 = *(char *)((long)pvVar40 + lVar41 + (long)iVar18 + 1);
          cVar3 = *(char *)((long)pvVar40 + lVar41 + (long)iVar18 + 2);
          cVar4 = *(char *)((long)pvVar40 + lVar41 + (long)iVar18 + 3);
          cVar5 = *(char *)((long)pvVar40 + lVar41 + (long)iVar18 + 4);
          cVar6 = *(char *)((long)pvVar40 + lVar41 + (long)iVar18 + 5);
          cVar7 = *(char *)((long)pvVar40 + lVar41 + (long)iVar18 + 6);
          cVar8 = *(char *)((long)pvVar40 + lVar41 + (long)iVar18 + 7);
          cVar9 = *(char *)((long)pvVar40 + lVar41 + (long)iVar18 + 8);
          lVar41 = 4;
          do {
            sVar10 = *(short *)(&UNK_0055053c + lVar41);
            sVar11 = *(short *)(&UNK_0055053e + lVar41);
            sVar12 = *(short *)((long)&DAT_00550540 + lVar41);
            *(short *)((long)&local_60 + lVar41 + 4) =
                 sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
            *(short *)((long)&local_60 + lVar41 + 6) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)auStack_56 + lVar41 + -2) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
            lVar41 = lVar41 + 6;
          } while (lVar41 != 0x28);
          lVar41 = 0;
          pvVar19 = pvVar25;
          do {
            sVar10 = *(short *)((long)auStack_56 + lVar41 * 6 + -2);
            uVar13 = *(uint *)((long)auStack_56 + lVar41 * 6);
            puVar29 = &DAT_00550542;
            lVar31 = 0;
            do {
              auVar16 = vpmullw_avx(ZEXT416(*puVar29),ZEXT416(uVar13));
              uVar35 = vpextrw_avx(auVar16,1);
              *(short *)((long)pvVar19 + lVar31 * 2) =
                   (short)uVar35 + auVar16._0_2_ + *(short *)((long)puVar29 + -2) * sVar10;
              lVar31 = lVar31 + 1;
              puVar29 = (uint *)((long)puVar29 + 6);
            } while (lVar31 != 6);
            lVar41 = lVar41 + 1;
            pvVar19 = (void *)((long)pvVar19 + 0xc);
          } while (lVar41 != 6);
          uVar20 = uVar20 + 1;
          pvVar25 = (void *)((long)pvVar25 + (long)local_a8.w * local_a8.elemsize);
        } while (uVar20 != (uint)inch);
      }
      local_118 = local_118 + 1;
      local_108 = (void *)((long)local_108 + local_a8.cstep * local_a8.elemsize);
    } while (local_118 != uVar24);
  }
  iVar18 = inch + 7;
  if (-1 < inch) {
    iVar18 = inch;
  }
  iVar21 = outch + 3;
  if (-1 < outch) {
    iVar21 = outch;
  }
  local_60 = uVar24;
  Mat::create(kernel_tm,iVar18 >> 3,0x24,iVar21 >> 2,0x40,0x20,(Allocator *)0x0);
  if (3 < outch) {
    lVar32 = local_a8.cstep * local_a8.elemsize;
    iVar18 = kernel_tm->w;
    pvVar25 = kernel_tm->data;
    sVar14 = kernel_tm->elemsize;
    sVar15 = kernel_tm->cstep;
    pvVar26 = (void *)(lVar32 * 3 + (long)local_a8.data);
    lVar41 = lVar32 * 4;
    lVar31 = (long)local_a8.w * local_a8.elemsize * 8;
    pvVar40 = (void *)((long)local_a8.data + lVar32 * 2);
    pvVar33 = (void *)(lVar32 + (long)local_a8.data);
    uVar20 = 0;
    pvVar19 = local_a8.data;
    do {
      lVar32 = 0;
      pvVar27 = pvVar26;
      pvVar39 = pvVar40;
      local_100 = pvVar33;
      local_f8 = pvVar19;
      do {
        if (7 < inch) {
          lVar30 = (long)pvVar25 + (long)iVar18 * sVar14 * lVar32 + (uVar20 >> 2) * sVar15 * sVar14;
          pvVar22 = local_f8;
          pvVar23 = local_100;
          lVar34 = 0;
          pvVar37 = pvVar27;
          pvVar42 = pvVar39;
          do {
            lVar38 = 0;
            lVar28 = 0;
            do {
              *(undefined2 *)(lVar30 + lVar28) = *(undefined2 *)((long)pvVar22 + lVar38);
              *(undefined2 *)(lVar30 + lVar28 + 2) = *(undefined2 *)((long)pvVar23 + lVar38);
              *(undefined2 *)(lVar30 + lVar28 + 4) = *(undefined2 *)((long)pvVar42 + lVar38);
              *(undefined2 *)(lVar30 + lVar28 + 6) = *(undefined2 *)((long)pvVar37 + lVar38);
              lVar28 = lVar28 + 8;
              lVar38 = lVar38 + (long)local_a8.w * local_a8.elemsize;
            } while (lVar28 != 0x40);
            lVar28 = lVar34 + 0xf;
            pvVar37 = (void *)((long)pvVar37 + lVar31);
            pvVar42 = (void *)((long)pvVar42 + lVar31);
            pvVar23 = (void *)((long)pvVar23 + lVar31);
            pvVar22 = (void *)((long)pvVar22 + lVar31);
            lVar30 = lVar30 + 0x40;
            lVar34 = lVar34 + 8;
          } while (lVar28 < inch);
        }
        lVar32 = lVar32 + 1;
        pvVar27 = (void *)((long)pvVar27 + 2);
        pvVar39 = (void *)((long)pvVar39 + 2);
        local_100 = (void *)((long)local_100 + 2);
        local_f8 = (void *)((long)local_f8 + 2);
      } while (lVar32 != 0x24);
      uVar36 = uVar20 + 7;
      pvVar26 = (void *)((long)pvVar26 + lVar41);
      pvVar40 = (void *)((long)pvVar40 + lVar41);
      pvVar33 = (void *)((long)pvVar33 + lVar41);
      pvVar19 = (void *)((long)pvVar19 + lVar41);
      uVar20 = uVar20 + 4;
    } while (uVar36 < uVar24);
  }
  piVar17 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(kernel, kernel_tm, inch, outch, opt);
}